

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<int>::btAlignedObjectArray
          (btAlignedObjectArray<int> *this,btAlignedObjectArray<int> *otherArray)

{
  uint uVar1;
  btAlignedObjectArray<int> *in_RSI;
  btAlignedObjectArray<int> *in_RDI;
  btAlignedObjectArray<int> *unaff_retaddr;
  int otherSize;
  btAlignedObjectArray<int> *this_00;
  btAlignedObjectArray<int> *pbVar2;
  int newsize;
  
  this_00 = in_RSI;
  pbVar2 = in_RDI;
  btAlignedAllocator<int,_16U>::btAlignedAllocator((btAlignedAllocator<int,_16U> *)in_RDI);
  newsize = (int)((ulong)pbVar2 >> 0x20);
  init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  uVar1 = size(this_00);
  resize(unaff_retaddr,newsize,(int *)this_00);
  copy(this_00,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)uVar1);
  return;
}

Assistant:

btAlignedObjectArray(const btAlignedObjectArray& otherArray)
		{
			init();

			int otherSize = otherArray.size();
			resize (otherSize);
			otherArray.copy(0, otherSize, m_data);
		}